

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall expr_packed_Test::TestBody(expr_packed_Test *this)

{
  bool bVar1;
  Generator *this_00;
  Var *this_01;
  Var *var;
  undefined1 local_180 [8];
  Context context;
  AssertHelper local_40;
  string local_38;
  
  kratos::Context::Context((Context *)local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"mod",
             (allocator<char> *)&context.tracked_generators_._M_h._M_single_bucket);
  this_00 = kratos::Context::generator((Context *)local_180,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"a",
             (allocator<char> *)&context.tracked_generators_._M_h._M_single_bucket);
  this_01 = kratos::Generator::var(this_00,&local_38,5,5);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"b",
             (allocator<char> *)&context.tracked_generators_._M_h._M_single_bucket);
  var = kratos::Generator::var(this_00,&local_38,5,5);
  std::__cxx11::string::~string((string *)&local_38);
  (*(var->super_IRNode)._vptr_IRNode[0x19])(var,0);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38.field_2._M_allocated_capacity = 0;
  local_38.field_2._8_8_ = 0;
  local_38._M_string_length = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    kratos::Var::operator+(this_01,var);
  }
  std::__cxx11::string::assign((char *)&local_38);
  testing::Message::Message((Message *)&context.tracked_generators_._M_h._M_single_bucket);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x1b0,local_38._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=
            (&local_40,(Message *)&context.tracked_generators_._M_h._M_single_bucket);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    (*(code *)(context.tracked_generators_._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
  }
  std::__cxx11::string::~string((string *)&local_38);
  kratos::Context::~Context((Context *)local_180);
  return;
}

Assistant:

TEST(expr, packed) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 5, 5);
    auto &b = mod.var("b", 5, 5);
    b.set_is_packed(false);
    EXPECT_THROW(a + b, VarException);
}